

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O3

void vocdel1(voccxdef *ctx,objnum objn,char *wrd1,prpnum prp,int really_delete,int revert,
            int keep_undo)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  vocwdef *pvVar5;
  vocdef *pvVar6;
  vocwdef *pvVar7;
  vocwdef *pvVar8;
  vocdef *pvVar9;
  uint uVar10;
  vocdef *pvVar11;
  vocdef *pvVar12;
  vocwdef *pvVar13;
  byte bVar14;
  int len2;
  int len1;
  char *wrd2;
  vocdef *local_80;
  char *local_78;
  int local_70;
  int local_6c;
  uint local_68;
  uint local_64;
  undefined8 local_60;
  vocdef *local_58;
  vocdef *local_50;
  vocdef *local_48;
  vocdef *local_40;
  char *local_38;
  
  local_78 = wrd1;
  local_6c = really_delete;
  if (wrd1 != (char *)0x0) {
    voc_parse_words(&local_78,(int *)&local_64,&local_38,(int *)&local_68);
  }
  pvVar11 = (vocdef *)ctx->voccxhsh;
  bVar4 = keep_undo != 0 && wrd1 != (char *)0x0;
  local_70 = 0x100;
  do {
    if (pvVar11->vocnxt != (vocdef *)0x0) {
      local_80 = (vocdef *)0x0;
      pvVar6 = pvVar11->vocnxt;
      local_58 = pvVar11;
      do {
        pvVar9 = pvVar6->vocnxt;
        pvVar12 = pvVar6;
        if (local_78 == (char *)0x0) {
LAB_00220120:
          uVar10 = pvVar6->vocwlst;
          if ((uVar10 != 0xffffffff) && (ctx->voccxwp[(ulong)uVar10 / 2000] != (vocwdef *)0x0)) {
            puVar1 = &pvVar6->vocwlst;
            local_48 = local_80;
            if (local_80 == (vocdef *)0x0) {
              local_48 = pvVar11;
            }
            local_60 = 0;
            pvVar7 = ctx->voccxwp[(ulong)uVar10 / 2000] + uVar10 % 2000;
            pvVar13 = (vocwdef *)0x0;
            local_50 = pvVar9;
            local_40 = pvVar6;
            do {
              uVar2 = pvVar7->vocwnxt;
              if (uVar2 == 0xffffffff) {
                pvVar8 = (vocwdef *)0x0;
              }
              else {
                pvVar8 = (vocwdef *)
                         ((long)&ctx->voccxwp[(ulong)uVar2 / 2000]->vocwnxt +
                         (ulong)(uVar2 % 2000 << 3));
              }
              pvVar5 = pvVar7;
              if (revert == 0) {
                if (pvVar7->vocwobj == objn) {
                  if (local_78 == (char *)0x0) {
                    bVar14 = true;
                  }
                  else {
                    bVar14 = pvVar7->vocwtyp == prp;
                  }
                  if ((local_6c != 0) || ((bool)bVar14 == false)) goto LAB_002201d5;
                  bVar14 = pvVar7->vocwflg;
                  if ((bVar14 & 4) == 0) {
                    if (bVar4) {
                      vocdusave_delwrd(ctx,objn,prp,(uint)bVar14,wrd1);
                      bVar14 = pvVar7->vocwflg;
                    }
                    pvVar7->vocwflg = bVar14 | 8;
                    goto LAB_002202fa;
                  }
                  goto LAB_002201dd;
                }
              }
              else {
                bVar14 = pvVar7->vocwflg & 4;
                pvVar7->vocwflg = pvVar7->vocwflg & 0xf7;
LAB_002201d5:
                if (bVar14 != 0) {
LAB_002201dd:
                  if (bVar4) {
                    vocdusave_delwrd(ctx,objn,prp,(uint)pvVar7->vocwflg,wrd1);
                    pvVar6 = local_40;
                  }
                  pvVar5 = pvVar13;
                  if (pvVar13 == (vocwdef *)0x0) {
                    pvVar5 = (vocwdef *)puVar1;
                  }
                  pvVar5->vocwnxt = pvVar7->vocwnxt;
                  pvVar7->vocwnxt = ctx->voccxwfre;
                  ctx->voccxwfre = uVar10;
                  pvVar5 = pvVar13;
                  if (*puVar1 == 0xffffffff) {
                    local_48->vocnxt = pvVar6->vocnxt;
                    pvVar6->vocnxt = ctx->voccxfre;
                    ctx->voccxfre = pvVar6;
                    local_60 = 1;
                  }
                }
              }
LAB_002202fa:
              pvVar7 = pvVar8;
              pvVar13 = pvVar5;
              uVar10 = uVar2;
            } while (pvVar8 != (vocwdef *)0x0);
            pvVar9 = local_50;
            pvVar11 = local_58;
            pvVar12 = pvVar6;
            if ((int)local_60 != 0) {
              pvVar12 = local_80;
            }
          }
        }
        else {
          bVar14 = pvVar6->voclen;
          if (local_64 == bVar14) {
            iVar3 = memicmp(pvVar6->voctxt,local_78,(ulong)bVar14);
            if ((iVar3 == 0) &&
               ((local_38 == (char *)0x0 ||
                ((local_68 == pvVar6->vocln2 &&
                 (iVar3 = memicmp(pvVar6->voctxt + bVar14,local_38,(ulong)pvVar6->vocln2),
                 iVar3 == 0)))))) goto LAB_00220120;
          }
        }
        pvVar6 = pvVar9;
        local_80 = pvVar12;
      } while (pvVar9 != (vocdef *)0x0);
    }
    pvVar11 = (vocdef *)&pvVar11->voclen;
    local_70 = local_70 + -1;
    if (local_70 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void vocdel1(voccxdef *ctx, objnum objn, char *wrd1, prpnum prp,
             int really_delete, int revert, int keep_undo)
{
    int       i;
    vocdef   *v;
    vocdef   *prv;
    vocdef   *nxt;
    vocdef  **vp;
    vocwdef  *vw;
    vocwdef  *prvw;
    vocwdef  *nxtw;
    uint      nxtidx;
    uint      idx;
    int       deleted_vocdef;
    char     *wrd2;
    int       len1, len2;
    int       do_del;
    char     *orgwrd;

    /* parse the word if provided */
    orgwrd = wrd1;
    if (wrd1)
        voc_parse_words(&wrd1, &len1, &wrd2, &len2);
    
    /* go through each hash value looking for matching words */
    for (i = VOCHASHSIZ, vp = ctx->voccxhsh ; i ; ++vp, --i)
    {
        /* go through all words in this hash chain */
        for (prv = (vocdef *)0, v = *vp ; v ; v = nxt)
        {
            /* remember next word in hash chain */
            nxt = v->vocnxt;

            /* if this word doesn't match, skip it */
            if (wrd1)
            {
                /* compare the first word */
                if (v->voclen != len1
                    || memicmp((char *)v->voctxt, wrd1, (size_t)len1))
                {
                    prv = v;
                    continue;
                }

                /* if there's a second word, compare it as well */
                if (wrd2 && (v->vocln2 != len2
                             || memicmp((char *)v->voctxt + len1,
                                        wrd2, (size_t)len2)))
                {
                    prv = v;
                    continue;
                }
            }

            /* presume we're not going to delete this vocdef */
            deleted_vocdef = FALSE;
            
            /* go through all object relations for this word */
            for (prvw = 0, idx = v->vocwlst, vw = vocwget(ctx, idx) ; vw ;
                 vw = nxtw, idx = nxtidx)
            {
                /* remember next word in relation list */
                nxtidx = vw->vocwnxt;
                nxtw = vocwget(ctx, nxtidx);

                /*
                 *   figure out whether to delete this word, based on the
                 *   caller's specified operating mode 
                 */
                if (revert)
                {
                    /* if reverting, delete all new words */
                    do_del = (vw->vocwflg & VOCFNEW);

                    /* also, remove the DELETED flag if present */
                    vw->vocwflg &= ~VOCFDEL;
                }
                else
                {
                    /*
                     *   delete the word if the object number matches,
                     *   AND either we're not searching for a specific
                     *   vocabulary word (in which case wrd1 will be null)
                     *   or the word matches the vocabulary word we're
                     *   seeking (in which case the part of speech must
                     *   match) 
                     */
                    do_del = (vw->vocwobj == objn
                              && (wrd1 == 0 || vw->vocwtyp == prp));

                    /*
                     *   if we're not in really_delete mode, and the word
                     *   matches and it wasn't dynamically added at
                     *   run-time, simply mark it as deleted -- this will
                     *   allow it to be undeleted if the game is reverted
                     *   to RESTART conditions 
                     */
                    if (do_del && !really_delete && !(vw->vocwflg & VOCFNEW))
                    {
                        /* geneate undo for the operation */
                        if (keep_undo && orgwrd)
                            vocdusave_delwrd(ctx, objn, prp,
                                             vw->vocwflg, orgwrd);
                        
                        /* just mark the word for deletion, but keep vw */
                        vw->vocwflg |= VOCFDEL;
                        do_del = FALSE;
                    }
                }

                /* now delete the structure if we decided we should */
                if (do_del)
                {
                    /* geneate undo for the operation */
                    if (keep_undo && orgwrd)
                        vocdusave_delwrd(ctx, objn, prp, vw->vocwflg, orgwrd);
                                         
                    /* unlink this vocwdef from the vocdef's list */
                    if (prvw)
                        prvw->vocwnxt = vw->vocwnxt;
                    else
                        v->vocwlst = vw->vocwnxt;

                    /* link the vocwdef into the vocwdef free list */
                    vw->vocwnxt = ctx->voccxwfre;
                    ctx->voccxwfre = idx;

                    /*
                     *   if there's nothing left in the vocdef's list,
                     *   delete the entire vocdef as well 
                     */
                    if (v->vocwlst == VOCCXW_NONE)
                    {
                        if (prv) prv->vocnxt = v->vocnxt;
                        else *vp = v->vocnxt;
                    
                        /* link into free chain */
                        v->vocnxt = ctx->voccxfre;
                        ctx->voccxfre = v;

                        /* note that it's been deleted */
                        deleted_vocdef = TRUE;
                    }
                }
                else
                {
                    /* we're not deleting the word, so move prvw forward */
                    prvw = vw;
                }
            }

            /* if we didn't delete this vocdef, move prv forward onto it */
            if (!deleted_vocdef)
                prv = v;
        }
    }
}